

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O3

void ztparse(void *yyp,int yymajor,ztlexinf_t *yyminor)

{
  byte *pbVar1;
  undefined8 *puVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  ztast_program_t *pzVar6;
  ztast_assignment_t *pzVar7;
  ztast_intarray_t *pzVar8;
  ztast_intarrayinner_t *pzVar9;
  ztast_statement_t *pzVar10;
  byte bVar11;
  long lVar12;
  char *pcVar13;
  byte *pbVar14;
  byte *pbVar15;
  ulong uVar16;
  
  pbVar15 = *yyp;
  puVar2 = *(undefined8 **)((long)yyp + 0x10);
  bVar4 = *pbVar15;
  pbVar1 = (byte *)((long)yyp + 0x18);
  do {
    if (bVar4 < 0x17) {
      lVar12 = (ulong)"+"[bVar4] + ((ulong)(uint)yymajor & 0xff);
      pbVar14 = "RRRRRRRRRRRRRRpo_RRcbRR" + bVar4;
      if ("\x19\x1a\x1b\x1c\x1d\x1e\x1f \b\t\x1b\v\f\r\x0e\x0f\t\x11\v\f\r\x06\x0f\a\a\x12\x14\x15\x16\x17\x18\x1b\x10\x10\x1e\x0f !\"\x01\x02\x03\x04"
          [lVar12] == (byte)yymajor) {
        pbVar14 = "\x15[\\]^\x10`\x10=\asCDEF\x03\a\x02CDE5\x0366IS\x05\x05X\x16rGH\x0f\x03\x0f\x12\x11\v\n\t\bU\x04\x04X\x16B\a6CDE\v\n\t\bVWX\x16\x0eT\x0e6M\f\x01\rT\reTed\x13d\x13\x14T\x14TJ\x06\t\b"
                  + lVar12;
      }
      bVar4 = *pbVar14;
    }
    if (bVar4 < 0x55) {
      if (bVar4 < 0x52) {
        *(byte **)yyp = pbVar15 + 0x10;
        if (*(byte **)((long)yyp + 0x658) < pbVar15 + 0x10) {
          *(byte **)yyp = pbVar15;
          if (pbVar1 < pbVar15) {
            *(byte **)yyp = pbVar15 + ((long)pbVar1 - (long)pbVar15 & 0xfffffffffffffff0);
          }
          builtin_strncpy(*(char **)(*(long *)((long)yyp + 0x10) + 8),"parser stack overflow",0x16);
          *(long *)((long)yyp + 0x10) = *(long *)((long)yyp + 0x10);
        }
        else {
          bVar11 = bVar4 + 0x24;
          if (bVar4 < 0x17) {
            bVar11 = bVar4;
          }
          pbVar15[0x10] = bVar11;
          pbVar15[0x11] = (byte)yymajor;
          *(ztlexinf_t **)(pbVar15 + 0x18) = yyminor;
        }
        *(int *)((long)yyp + 8) = *(int *)((long)yyp + 8) + -1;
        return;
      }
      if (bVar4 == 0x53) {
        *(byte **)yyp = pbVar15 + -0x10;
      }
      else {
        if (*(int *)((long)yyp + 8) < 1) {
          lVar12 = *(long *)((long)yyp + 0x10);
          pcVar13 = *(char **)(lVar12 + 8);
          if (yyminor == (ztlexinf_t *)0x0) {
            builtin_strncpy(pcVar13,"syntax error",0xd);
          }
          else {
            sprintf(pcVar13,"syntax error at line %d column %d",(ulong)(uint)yyminor->line,
                    (ulong)(uint)yyminor->column);
          }
          *(long *)((long)yyp + 0x10) = lVar12;
        }
        *(undefined4 *)((long)yyp + 8) = 3;
        if (yymajor != 0) {
          return;
        }
        pbVar15 = *yyp;
        if (pbVar1 < pbVar15) {
          *(byte **)yyp = pbVar15 + ((long)pbVar1 - (long)pbVar15 & 0xfffffffffffffff0);
        }
      }
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
      return;
    }
    uVar16 = (ulong)(bVar4 - 0x55);
    switch(uVar16) {
    case 0:
      if (pbVar15 < *(byte **)((long)yyp + 0x658)) {
        pzVar6 = ztast_program((ztast_t *)*puVar2,(ztast_statement_t *)0x0);
        *(ztast_program_t **)(pbVar15 + 0x18) = pzVar6;
        goto switchD_00102ef6_default;
      }
      if (pbVar1 < pbVar15) {
        *(byte **)yyp = pbVar15 + ((long)pbVar1 - (long)pbVar15 & 0xfffffffffffffff0);
      }
      builtin_strncpy(*(char **)(*(long *)((long)yyp + 0x10) + 8),"parser stack overflow",0x16);
      *(long *)((long)yyp + 0x10) = *(long *)((long)yyp + 0x10);
      pbVar15 = *yyp;
      bVar4 = 0;
      goto LAB_00103204;
    case 1:
      pzVar10 = (ztast_statement_t *)
                ztast_program((ztast_t *)*puVar2,*(ztast_statement_t **)(pbVar15 + 8));
      break;
    case 2:
      ztast_statement_append
                ((ztast_t *)*puVar2,*(ztast_statement_t **)(pbVar15 + -8),
                 *(ztast_statement_t **)(pbVar15 + 8));
      goto switchD_00102ef6_default;
    case 3:
      pzVar10 = ztast_statement_from_assignment
                          ((ztast_t *)*puVar2,*(ztast_assignment_t **)(pbVar15 + 8));
      break;
    case 4:
      pzVar7 = ztast_assignment((ztast_t *)*puVar2,*(ztast_id_t **)(pbVar15 + -0x28),
                                *(ztast_expr_t **)(pbVar15 + -8));
      *(ztast_assignment_t **)(pbVar15 + -0x28) = pzVar7;
      goto switchD_00102ef6_default;
    case 5:
      pzVar10 = (ztast_statement_t *)
                ztast_id((ztast_t *)*puVar2,(char *)(*(long *)(pbVar15 + 8) + 0xc));
      break;
    case 6:
      pzVar10 = (ztast_statement_t *)
                ztast_expr_from_value((ztast_t *)*puVar2,*(ztast_value_t **)(pbVar15 + 8));
      break;
    case 7:
      pzVar10 = (ztast_statement_t *)
                ztast_expr_from_scope((ztast_t *)*puVar2,*(ztast_scope_t **)(pbVar15 + 8));
      break;
    case 8:
      pzVar10 = (ztast_statement_t *)
                ztast_expr_from_intarray((ztast_t *)*puVar2,*(ztast_intarray_t **)(pbVar15 + 8));
      break;
    case 9:
      pzVar10 = (ztast_statement_t *)
                ztast_expr_from_scopearray((ztast_t *)*puVar2,*(ztast_scopearray_t **)(pbVar15 + 8))
      ;
      break;
    case 10:
      pzVar10 = (ztast_statement_t *)
                ztast_value_from_integer((ztast_t *)*puVar2,*(int *)(pbVar15 + 8));
      break;
    case 0xb:
      pzVar10 = (ztast_statement_t *)
                ztast_value_from_decimal((ztast_t *)*puVar2,*(int *)(pbVar15 + 8));
      break;
    case 0xc:
      pzVar10 = (ztast_statement_t *)ztast_value_nil((ztast_t *)*puVar2);
      break;
    case 0xd:
      *(int *)(pbVar15 + -0x18) = *(int *)(pbVar15 + -0x18) + *(int *)(pbVar15 + 8);
      goto switchD_00102ef6_default;
    case 0xe:
      *(int *)(pbVar15 + -0x18) = *(int *)(pbVar15 + -0x18) - *(int *)(pbVar15 + 8);
      goto switchD_00102ef6_default;
    case 0xf:
      iVar5 = *(int *)(pbVar15 + 8) * *(int *)(pbVar15 + -0x18);
      goto LAB_00103058;
    case 0x10:
      iVar5 = *(int *)(pbVar15 + -0x18) / *(int *)(pbVar15 + 8);
      goto LAB_00103058;
    case 0x11:
      iVar5 = *(int *)(pbVar15 + -8);
LAB_00103058:
      *(int *)(pbVar15 + -0x18) = iVar5;
      goto switchD_00102ef6_default;
    case 0x12:
      iVar5 = atoi((char *)(*(long *)(pbVar15 + 8) + 0xc));
      goto LAB_001030db;
    case 0x13:
      pcVar13 = (char *)(*(long *)(pbVar15 + 8) + 0xd);
      goto LAB_0010314b;
    case 0x14:
      pcVar13 = (char *)(*(long *)(pbVar15 + 8) + 0xe);
LAB_0010314b:
      lVar12 = strtol(pcVar13,(char **)0x0,0x10);
      *(int *)(pbVar15 + 8) = (int)lVar12;
      goto switchD_00102ef6_default;
    case 0x15:
      dVar3 = atof((char *)(*(long *)(pbVar15 + 8) + 0xc));
      iVar5 = (int)(dVar3 * 100.0);
LAB_001030db:
      *(int *)(pbVar15 + 8) = iVar5;
      goto switchD_00102ef6_default;
    case 0x16:
      pzVar8 = (ztast_intarray_t *)ztast_scope((ztast_t *)*puVar2,(ztast_statement_t *)0x0);
      goto LAB_0010313b;
    case 0x17:
      pzVar9 = (ztast_intarrayinner_t *)
               ztast_scope((ztast_t *)*puVar2,*(ztast_statement_t **)(pbVar15 + -8));
      goto LAB_00103184;
    case 0x18:
      pzVar8 = ztast_intarray((ztast_t *)*puVar2,(ztast_intarrayinner_t *)0x0);
LAB_0010313b:
      *(ztast_intarray_t **)(pbVar15 + -8) = pzVar8;
      goto switchD_00102ef6_default;
    case 0x19:
      pzVar9 = (ztast_intarrayinner_t *)
               ztast_intarray((ztast_t *)*puVar2,*(ztast_intarrayinner_t **)(pbVar15 + -8));
      goto LAB_00103184;
    case 0x1a:
      pzVar10 = (ztast_statement_t *)
                ztast_intarrayinner_append
                          ((ztast_t *)*puVar2,(ztast_intarrayinner_t *)0x0,*(int *)(pbVar15 + 8));
      break;
    case 0x1b:
      pzVar9 = ztast_intarrayinner_append
                         ((ztast_t *)*puVar2,*(ztast_intarrayinner_t **)(pbVar15 + -0x18),
                          *(int *)(pbVar15 + 8));
      goto LAB_00103184;
    case 0x1c:
      pzVar9 = (ztast_intarrayinner_t *)
               ztast_scopearray((ztast_t *)*puVar2,*(ztast_scopearrayinner_t **)(pbVar15 + -8));
      goto LAB_00103184;
    case 0x1d:
      pzVar10 = (ztast_statement_t *)
                ztast_scopearrayinner_append
                          ((ztast_t *)*puVar2,(ztast_scopearrayinner_t *)0x0,
                           *(ztast_scope_t **)(pbVar15 + 8));
      break;
    case 0x1e:
      pzVar9 = (ztast_intarrayinner_t *)
               ztast_scopearrayinner_append
                         ((ztast_t *)*puVar2,*(ztast_scopearrayinner_t **)(pbVar15 + -0x18),
                          *(ztast_scope_t **)(pbVar15 + 8));
LAB_00103184:
      *(ztast_intarrayinner_t **)(pbVar15 + -0x18) = pzVar9;
    default:
      goto switchD_00102ef6_default;
    }
    *(ztast_statement_t **)(pbVar15 + 8) = pzVar10;
switchD_00102ef6_default:
    bVar11 = "\x14\x14\x15\x16\x17\x18\x19\x19\x19\x19\x1a\x1a\x1a\x1e\x1e\x1e\x1e\x1e   \x1f\x1b\x1b\x1c\x1c!!\x1d\"\"\x15\x1e"
             [uVar16];
    pbVar14 = pbVar15 + (long)""[uVar16] * 0x10;
    pbVar15 = pbVar14 + 0x10;
    bVar4 = "\x15[\\]^\x10`\x10=\asCDEF\x03\a\x02CDE5\x0366IS\x05\x05X\x16rGH\x0f\x03\x0f\x12\x11\v\n\t\bU\x04\x04X\x16B\a6CDE\v\n\t\bVWX\x16\x0eT\x0e6M\f\x01\rT\reTed\x13d\x13\x14T\x14TJ\x06\t\b"
            [(long)yy_reduce_ofst[*pbVar14] + (ulong)bVar11];
    *(byte **)yyp = pbVar15;
    *pbVar15 = bVar4;
    pbVar14[0x11] = bVar11;
LAB_00103204:
    if (pbVar15 <= pbVar1) {
      return;
    }
  } while( true );
}

Assistant:

void ztparse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  ztparseTOKENTYPE yyminor       /* The value for the token */
  ztparseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  YYACTIONTYPE yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser = (yyParser*)yyp;  /* The parser */
  ztparseCTX_FETCH
  ztparseARG_STORE

  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif

  yyact = yypParser->yytos->stateno;
#ifndef NDEBUG
  if( yyTraceFILE ){
    if( yyact < YY_MIN_REDUCE ){
      fprintf(yyTraceFILE,"%sInput '%s' in state %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact);
    }else{
      fprintf(yyTraceFILE,"%sInput '%s' with pending reduce %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact-YY_MIN_REDUCE);
    }
  }
#endif

  do{
    assert( yyact==yypParser->yytos->stateno );
    yyact = yy_find_shift_action((YYCODETYPE)yymajor,yyact);
    if( yyact >= YY_MIN_REDUCE ){
      yyact = yy_reduce(yypParser,yyact-YY_MIN_REDUCE,yymajor,
                        yyminor ztparseCTX_PARAM);
    }else if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,(YYCODETYPE)yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      break;
    }else if( yyact==YY_ACCEPT_ACTION ){
      yypParser->yytos--;
      yy_accept(yypParser);
      return;
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) > YY_MAX_SHIFTREDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
      if( yymajor==YYNOCODE ) break;
      yyact = yypParser->yytos->stateno;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      break;
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      break;
#endif
    }
  }while( yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
  }
#endif
  return;
}